

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O3

int event_callback_cancel_nolock_(event_base *base,event_callback *evcb,int even_if_finalizing)

{
  byte bVar1;
  uint8_t uVar2;
  ushort uVar3;
  unsigned_long uVar4;
  long lVar5;
  void *pvVar6;
  _func_void_int_short_void_ptr *p_Var7;
  eventop *peVar8;
  eventop *peVar9;
  event_change *peVar10;
  short sVar11;
  int iVar12;
  uint uVar13;
  int extraout_EAX;
  _func_unsigned_long *p_Var14;
  unsigned_long uVar15;
  ulong uVar16;
  uint uVar17;
  char *pcVar18;
  event_callback *evcb_00;
  event_callback *extraout_RDX;
  event_callback *extraout_RDX_00;
  event_callback *extraout_RDX_01;
  event_callback *extraout_RDX_02;
  char *pcVar19;
  event_callback *extraout_RDX_03;
  event_callback *extraout_RDX_04;
  event_callback *extraout_RDX_05;
  event_callback *extraout_RDX_06;
  event_callback *extraout_RDX_07;
  event_callback *extraout_RDX_08;
  event_callback *extraout_RDX_09;
  event_callback *extraout_RDX_10;
  event_callback *extraout_RDX_11;
  event_callback *extraout_RDX_12;
  event_callback *extraout_RDX_13;
  event_callback *extraout_RDX_14;
  event_callback *extraout_RDX_15;
  event_callback *extraout_RDX_16;
  long lVar20;
  event_callback *extraout_RDX_17;
  _func_void_int_short_void_ptr *unaff_RBX;
  undefined8 *puVar21;
  undefined1 *puVar22;
  undefined8 unaff_RBP;
  event *ev;
  void *pvVar23;
  short *psVar24;
  char *pcVar25;
  long lVar26;
  evthread_lock_callbacks *unaff_R12;
  int unaff_R13D;
  event_base *unaff_R14;
  timeval *ptVar27;
  event_base *unaff_R15;
  bool bVar28;
  undefined1 auStack_8 [8];
  
  puVar22 = auStack_8;
  uVar3 = evcb->evcb_flags;
  if ((even_if_finalizing == 0 & (byte)((uVar3 & 0x40) >> 6)) != 0) {
    UINT_00302c0c._3_1_ = 0xff;
    return 0;
  }
  if ((char)uVar3 < '\0') {
    if ((char)uVar3 < '\0') {
      iVar12 = event_del_nolock_((event *)evcb,3 - (uint)(even_if_finalizing == 0));
      return iVar12;
    }
    event_callback_cancel_nolock__cold_1();
switchD_002cf51e_caseD_5:
    event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/event.c"
               ,0xc0d,"0","event_callback_cancel_nolock_");
  }
  uVar17 = uVar3 >> 3 & 5;
  p_Var14 = (_func_unsigned_long *)(ulong)uVar17;
  evcb_00 = (event_callback *)
            ((long)&switchD_002cf51e::switchdataD_00302be8 +
            (long)(int)(&switchD_002cf51e::switchdataD_00302be8)[(long)p_Var14]);
  bVar28 = evcb_00 == (event_callback *)0x0;
  switch(uVar17) {
  case 0:
    goto switchD_002cf51e_caseD_0;
  case 1:
    event_queue_remove_active(base,evcb);
    break;
  default:
    puVar22 = &stack0xffffffffffffffe0;
    p_Var14 = (_func_unsigned_long *)(ulong)(ushort)evcb->evcb_flags;
    unaff_RBX = (_func_void_int_short_void_ptr *)0x0;
    unaff_R14 = base;
    unaff_R15 = (event_base *)evcb;
    if ((evcb->evcb_flags & 0x40U) != 0) goto switchD_002cf5a9_caseD_1;
    goto code_r0x002cf595;
  case 4:
    event_queue_remove_active_later(base,evcb);
    break;
  case 5:
    goto switchD_002cf51e_caseD_5;
  case 6:
    evcb = (event_callback *)((ulong)base & 0xffffffff);
    puVar22 = auStack_8;
code_r0x002cf595:
    uVar13 = (uint)((ulong)p_Var14 >> 3) & 5;
    uVar17 = (&switchD_002cf5a9::switchdataD_00302c00)[uVar13];
    switch(uVar13) {
    case 0:
      unaff_RBX = (_func_void_int_short_void_ptr *)0x1;
      break;
    case 1:
      goto switchD_002cf5a9_caseD_1;
    default:
      *(event_base **)(puVar22 + -8) = unaff_R15;
      *(event_base **)(puVar22 + -0x10) = unaff_R14;
      *(_func_void_int_short_void_ptr **)(puVar22 + -0x18) = unaff_RBX;
      pvVar23 = base->th_base_lock;
      if (pvVar23 != (void *)0x0) {
        *(undefined8 *)(puVar22 + -0x20) = 0x2cf722;
        (*evthread_lock_fns_.lock)(0,pvVar23);
      }
      *(undefined8 *)(puVar22 + -0x20) = 0x2cf730;
      event_callback_finalize_nolock_
                (base,(uint)pvVar23,evcb_00,
                 (_func_void_event_callback_ptr_void_ptr *)&switchD_002cf5a9::switchdataD_00302c00);
      if (base->th_base_lock != (void *)0x0) {
        iVar12 = (*evthread_lock_fns_.unlock)(0,base->th_base_lock);
        return iVar12;
      }
      return extraout_EAX;
    case 4:
      *(undefined8 *)(puVar22 + -8) = 0x2cf5bd;
      event_queue_remove_active_later(unaff_R14,(event_callback *)unaff_R15);
      unaff_RBX = (_func_void_int_short_void_ptr *)0x0;
      break;
    case 5:
      goto switchD_002cf5a9_caseD_5;
    case 6:
code_r0x002d1133:
      *(undefined8 *)(puVar22 + -8) = 0x2d1136;
      (*evthread_lock_fns_.unlock)((uint)base,evcb);
      evcb_00 = extraout_RDX_09;
LAB_002d1136:
      pvVar23 = (((event *)unaff_R12)->ev_evcallback).evcb_arg;
      *(undefined8 *)(puVar22 + -8) = 0x2d1140;
      (*unaff_RBX)((int)unaff_R12,(short)pvVar23,evcb_00);
      evcb_00 = extraout_RDX_10;
LAB_002d1327:
      unaff_R14 = *(event_base **)(puVar22 + 8);
      unaff_R12 = &evthread_lock_fns_;
LAB_002d1333:
      pvVar23 = unaff_R15->th_base_lock;
      if (pvVar23 != (void *)0x0) {
        p_Var7 = (((event *)unaff_R12)->ev_evcallback).evcb_cb_union.evcb_callback;
        *(undefined8 *)(puVar22 + -8) = 0x2d1346;
        (*p_Var7)(0,(short)pvVar23,evcb_00);
      }
      unaff_R15->current_event = (event_callback *)0x0;
      if (unaff_R15->current_event_waiters != 0) {
        unaff_R15->current_event_waiters = 0;
        pvVar23 = unaff_R15->current_event_cond;
        if (pvVar23 != (void *)0x0) {
          *(undefined8 *)(puVar22 + -8) = 0x2d1381;
          (*evthread_cond_fns_.signal_condition)(pvVar23,1);
        }
      }
      if (unaff_R15->event_break != 0) {
        return -1;
      }
      if (*(int *)(puVar22 + 0x34) <= unaff_R13D) {
        return unaff_R13D;
      }
      if ((unaff_R14 != (event_base *)0x0) && (unaff_R13D != 0)) {
        (unaff_R15->tv_cache).tv_sec = 0;
        if ((unaff_R15->flags & EVENT_BASE_FLAG_NO_CACHE_TIME) == 0) {
          *(undefined8 *)(puVar22 + -8) = 0x2d13be;
          gettime(unaff_R15,*(timeval **)(puVar22 + 0x38));
        }
        *(undefined8 *)(puVar22 + -8) = 0x2d13cb;
        gettime(unaff_R15,(timeval *)(puVar22 + 0x10));
        peVar8 = unaff_R14->evsel;
        peVar9 = *(eventop **)(puVar22 + 0x10);
        bVar28 = SBORROW8((long)peVar9,(long)peVar8);
        lVar20 = (long)peVar9 - (long)peVar8;
        if (peVar9 == peVar8) {
          bVar28 = SBORROW8(*(long *)(puVar22 + 0x18),(long)unaff_R14->evbase);
          lVar20 = *(long *)(puVar22 + 0x18) - (long)unaff_R14->evbase;
        }
        if (bVar28 == lVar20 < 0) {
          return unaff_R13D;
        }
      }
      if (unaff_R15->event_continue != 0) {
        return unaff_R13D;
      }
      unaff_R12 = (evthread_lock_callbacks *)**(undefined8 **)(puVar22 + 0x40);
      if ((event *)unaff_R12 == (event *)0x0) {
        return unaff_R13D;
      }
      uVar3 = (((event *)unaff_R12)->ev_evcallback).evcb_flags;
      if ((char)uVar3 < '\0') {
        if ((uVar3 & 0x40) == 0 && (((event *)unaff_R12)->ev_events & 0x10U) == 0) {
          *(undefined8 *)(puVar22 + -8) = 0x2d0f27;
          event_del_nolock_((event *)unaff_R12,0);
          evcb_00 = extraout_RDX_02;
        }
        else {
          *(undefined8 *)(puVar22 + -8) = 0x2d0f1b;
          event_queue_remove_active(unaff_R15,(event_callback *)unaff_R12);
          evcb_00 = extraout_RDX_01;
        }
        ev = (event *)unaff_R12;
        if (event_debug_logging_mask_ != 0) {
          uVar3 = ((event *)unaff_R12)->ev_res;
          pcVar19 = "EV_READ ";
          if ((uVar3 & 2) == 0) {
            pcVar19 = " ";
          }
          pcVar18 = "EV_WRITE ";
          if ((uVar3 & 4) == 0) {
            pcVar18 = " ";
          }
          pcVar25 = "EV_CLOSED ";
          if (-1 < (char)uVar3) {
            pcVar25 = " ";
          }
          p_Var7 = (((event *)unaff_R12)->ev_evcallback).evcb_cb_union.evcb_callback;
          *(undefined8 *)(puVar22 + -8) = 0x2d0f80;
          event_debugx_("event_process_active: event: %p, %s%s%scall %p",unaff_R12,pcVar19,pcVar18,
                        pcVar25,p_Var7);
          evcb_00 = extraout_RDX_03;
        }
      }
      else {
        *(undefined8 *)(puVar22 + -8) = 0x2d0ed0;
        event_queue_remove_active(unaff_R15,(event_callback *)unaff_R12);
        evcb_00 = extraout_RDX;
        if (event_debug_logging_mask_ != 0) {
          bVar1 = (((event *)unaff_R12)->ev_evcallback).evcb_closure;
          p_Var7 = (((event *)unaff_R12)->ev_evcallback).evcb_cb_union.evcb_callback;
          *(undefined8 *)(puVar22 + -8) = 0x2d0ef8;
          event_debugx_("event_process_active: event_callback %p, closure %d, call %p",unaff_R12,
                        (ulong)bVar1,p_Var7);
          evcb_00 = extraout_RDX_00;
        }
        ev = (event *)0x0;
      }
      unaff_R13D = unaff_R13D +
                   (uint)(((((event *)unaff_R12)->ev_evcallback).evcb_flags & 0x10U) == 0);
      unaff_R15->current_event = (event_callback *)unaff_R12;
      unaff_R15->current_event_waiters = 0;
      uVar2 = (((event *)unaff_R12)->ev_evcallback).evcb_closure;
      switch(uVar2) {
      case '\0':
        if (ev == (event *)0x0) goto LAB_002d1421;
        p_Var7 = (ev->ev_evcallback).evcb_cb_union.evcb_callback;
        sVar11 = ev->ev_res;
        pvVar23 = unaff_R15->th_base_lock;
        unaff_R12 = &evthread_lock_fns_;
        if (pvVar23 != (void *)0x0) {
          *(undefined8 *)(puVar22 + -8) = 0x2d1171;
          (*evthread_lock_fns_.unlock)(0,pvVar23);
        }
        iVar12 = ev->ev_fd;
        pvVar23 = (ev->ev_evcallback).evcb_arg;
        *(undefined8 *)(puVar22 + -8) = 0x2d117e;
        (*p_Var7)(iVar12,sVar11,pvVar23);
        unaff_R14 = *(event_base **)(puVar22 + 8);
        evcb_00 = extraout_RDX_11;
        goto LAB_002d1333;
      case '\x01':
        if (ev == (event *)0x0) goto LAB_002d1426;
        sVar11 = (ev->ev_).ev_signal.ev_ncalls;
        *(short *)(puVar22 + 0x10) = sVar11;
        if (sVar11 != 0) {
          (ev->ev_).ev_signal.ev_pncalls = (short *)(puVar22 + 0x10);
        }
        pvVar23 = unaff_R15->th_base_lock;
        unaff_R14 = *(event_base **)(puVar22 + 8);
        unaff_R12 = &evthread_lock_fns_;
        if (pvVar23 != (void *)0x0) {
          *(undefined8 *)(puVar22 + -8) = 0x2d11c7;
          (*evthread_lock_fns_.unlock)(0,pvVar23);
          evcb_00 = extraout_RDX_12;
        }
        do {
          if (*(short *)(puVar22 + 0x10) == 0) goto LAB_002d1333;
          sVar11 = *(short *)(puVar22 + 0x10) + -1;
          *(short *)(puVar22 + 0x10) = sVar11;
          (ev->ev_).ev_signal.ev_ncalls = sVar11;
          if (sVar11 == 0) {
            (ev->ev_).ev_io.ev_timeout.tv_usec = 0;
          }
          iVar12 = ev->ev_fd;
          sVar11 = ev->ev_res;
          pvVar23 = (ev->ev_evcallback).evcb_arg;
          p_Var7 = (ev->ev_evcallback).evcb_cb_union.evcb_callback;
          *(undefined8 *)(puVar22 + -8) = 0x2d11f9;
          (*p_Var7)(iVar12,sVar11,pvVar23);
          pvVar23 = unaff_R15->th_base_lock;
          if (pvVar23 == (void *)0x0) {
            iVar12 = unaff_R15->event_break;
            evcb_00 = extraout_RDX_13;
          }
          else {
            *(undefined8 *)(puVar22 + -8) = 0x2d120c;
            (*evthread_lock_fns_.lock)(0,pvVar23);
            pvVar23 = unaff_R15->th_base_lock;
            iVar12 = unaff_R15->event_break;
            evcb_00 = extraout_RDX_14;
            if (pvVar23 != (void *)0x0) {
              *(undefined8 *)(puVar22 + -8) = 0x2d1226;
              (*evthread_lock_fns_.unlock)(0,pvVar23);
              evcb_00 = extraout_RDX_15;
            }
          }
        } while (iVar12 == 0);
        if (*(short *)(puVar22 + 0x10) != 0) {
          (ev->ev_).ev_io.ev_timeout.tv_usec = 0;
        }
        goto LAB_002d1333;
      case '\x02':
        goto switchD_002d0fc4_caseD_2;
      case '\x03':
        unaff_RBX = (((event *)unaff_R12)->ev_evcallback).evcb_cb_union.evcb_callback;
        evcb = (event_callback *)unaff_R15->th_base_lock;
        if (evcb == (event_callback *)0x0) goto LAB_002d1136;
        base = (event_base *)0x0;
        goto code_r0x002d1133;
      case '\x04':
        p_Var7 = (((event *)unaff_R12)->ev_evcallback).evcb_cb_union.evcb_callback;
        unaff_R15->current_event = (event_callback *)0x0;
        if (((((event *)unaff_R12)->ev_evcallback).evcb_flags & 0x40) == 0) goto LAB_002d142b;
        pvVar23 = unaff_R15->th_base_lock;
        if (pvVar23 != (void *)0x0) {
          *(undefined8 *)(puVar22 + -8) = 0x2d1072;
          (*evthread_lock_fns_.unlock)(0,pvVar23);
          evcb_00 = extraout_RDX_07;
        }
        pvVar23 = (((event *)unaff_R12)->ev_evcallback).evcb_arg;
        *(undefined8 *)(puVar22 + -8) = 0x2d107d;
        (*p_Var7)((int)unaff_R12,(short)pvVar23,evcb_00);
        evcb_00 = extraout_RDX_08;
        goto LAB_002d1327;
      case '\x05':
      case '\x06':
        if (ev == (event *)0x0) {
          *(undefined8 *)(puVar22 + -8) = 0x2d1417;
          event_process_active_single_queue_cold_3();
LAB_002d1417:
          *(undefined8 *)(puVar22 + -8) = 0x2d141c;
          event_process_active_single_queue_cold_2();
          goto LAB_002d141c;
        }
        unaff_R15->current_event = (event_callback *)0x0;
        if (((((event *)unaff_R12)->ev_evcallback).evcb_flags & 0x40) == 0) goto LAB_002d1417;
        p_Var7 = (ev->ev_evcallback).evcb_cb_union.evcb_callback;
        pvVar23 = unaff_R15->th_base_lock;
        unaff_R12 = &evthread_lock_fns_;
        if (pvVar23 != (void *)0x0) {
          *(undefined8 *)(puVar22 + -8) = 0x2d1004;
          (*evthread_lock_fns_.unlock)(0,pvVar23);
          evcb_00 = extraout_RDX_04;
        }
        pvVar23 = (ev->ev_evcallback).evcb_arg;
        *(undefined8 *)(puVar22 + -8) = 0x2d100d;
        (*p_Var7)((int)ev,(short)pvVar23,evcb_00);
        *(undefined8 *)(puVar22 + -8) = 0x2d1015;
        event_debug_note_teardown_(ev);
        unaff_R14 = *(event_base **)(puVar22 + 8);
        evcb_00 = extraout_RDX_05;
        if (uVar2 == '\x06') {
          if (mm_free_fn_ == (_func_void_void_ptr *)0x0) {
            *(undefined8 *)(puVar22 + -8) = 0x2d1251;
            free(ev);
            evcb_00 = extraout_RDX_16;
          }
          else {
            *(undefined8 *)(puVar22 + -8) = 0x2d1039;
            (*mm_free_fn_)(ev);
            evcb_00 = extraout_RDX_06;
          }
        }
        goto LAB_002d1333;
      default:
        goto switchD_002d0fc4_default;
      }
    case 7:
      unaff_RBX[-0x74b7c783] = (code)0x0;
      puVar21 = (undefined8 *)(puVar22 + -8);
      puVar22 = puVar22 + -8;
      *puVar21 = unaff_RBP;
      UINT_00302c0c._3_1_ = (char)uVar17;
      goto LAB_002d1333;
    }
    pvVar23 = unaff_R14->th_base_lock;
    if ((pvVar23 != (void *)0x0) && (evthread_lock_debugging_enabled_ != 0)) {
      *(undefined8 *)(puVar22 + -8) = 0x2cf5dc;
      iVar12 = evthread_is_debug_lock_held_(pvVar23);
      if (iVar12 != 0) goto LAB_002cf5e4;
      *(undefined8 *)(puVar22 + -8) = 0x2cf6ca;
      event_callback_activate_nolock__cold_2();
LAB_002cf6ca:
      *(undefined8 *)(puVar22 + -8) = 0x2cf6cf;
      event_callback_activate_nolock__cold_1();
switchD_002cf5a9_caseD_5:
      *(code **)(puVar22 + -8) = event_callback_finalize_;
      event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/event.c"
                 ,0xbcb,"0","event_callback_activate_nolock_");
    }
LAB_002cf5e4:
    peVar10 = (unaff_R15->changelist).changes;
    if (((ulong)peVar10 & 8) == 0) {
      iVar12 = unaff_R14->event_count + (uint)(((ulong)peVar10 & 0x10) == 0);
      unaff_R14->event_count = iVar12;
      if (iVar12 < unaff_R14->event_count_max) {
        iVar12 = unaff_R14->event_count_max;
      }
      unaff_R14->event_count_max = iVar12;
      *(byte *)&(unaff_R15->changelist).changes = *(byte *)&(unaff_R15->changelist).changes | 8;
      iVar12 = unaff_R14->event_count_active + 1;
      unaff_R14->event_count_active = iVar12;
      if (iVar12 < unaff_R14->event_count_active_max) {
        iVar12 = unaff_R14->event_count_active_max;
      }
      unaff_R14->event_count_active_max = iVar12;
      bVar1 = *(byte *)((long)&(unaff_R15->changelist).changes + 2);
      if (unaff_R14->nactivequeues <= (int)(uint)bVar1) goto LAB_002cf6ca;
      unaff_R15->evsel = (eventop *)0x0;
      unaff_R15->evbase = unaff_R14->activequeues[bVar1].tqh_last;
      *unaff_R14->activequeues[bVar1].tqh_last = (event_callback *)unaff_R15;
      unaff_R14->activequeues[*(byte *)((long)&(unaff_R15->changelist).changes + 2)].tqh_last =
           (event_callback **)unaff_R15;
    }
    if (evthread_id_fn_ != (_func_unsigned_long *)0x0) {
      bVar28 = unaff_R14->running_loop == 0;
      p_Var14 = evthread_id_fn_;
switchD_002cf51e_caseD_7:
      if (!bVar28) {
        uVar4 = unaff_R14->th_owner_id;
        *(undefined8 *)(puVar22 + -8) = 0x2cf6b0;
        uVar15 = (*p_Var14)();
        if (uVar4 != uVar15) {
          *(undefined8 *)(puVar22 + -8) = 0x2cf6bd;
          evthread_notify_base(unaff_R14);
        }
      }
    }
switchD_002cf5a9_caseD_1:
    return (int)unaff_RBX;
  case 7:
    goto switchD_002cf51e_caseD_7;
  }
  uVar17 = 0;
switchD_002cf51e_caseD_0:
  return uVar17;
switchD_002d0fc4_caseD_2:
  if (ev == (event *)0x0) {
LAB_002d141c:
    *(undefined8 *)(puVar22 + -8) = 0x2d1421;
    event_process_active_single_queue_cold_6();
LAB_002d1421:
    *(undefined8 *)(puVar22 + -8) = 0x2d1426;
    event_process_active_single_queue_cold_4();
LAB_002d1426:
    *(undefined8 *)(puVar22 + -8) = 0x2d142b;
    event_process_active_single_queue_cold_7();
LAB_002d142b:
    *(undefined8 *)(puVar22 + -8) = 0x2d1430;
    event_process_active_single_queue_cold_1();
    *(undefined8 *)(puVar22 + -8) = 0x2d1435;
    event_process_active_single_queue_cold_8();
LAB_002d1435:
    *(undefined8 *)(puVar22 + -8) = 0x2d143a;
    event_process_active_single_queue_cold_5();
switchD_002d0fc4_default:
    *(code **)(puVar22 + -8) = evthread_notify_base_eventfd;
    event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/event.c"
               ,0x6c2,"0","event_process_active_single_queue");
  }
  uVar16 = (ev->ev_).ev_io.ev_timeout.tv_usec;
  if ((ev->ev_).ev_io.ev_timeout.tv_sec == 0 && uVar16 == 0) goto LAB_002d12f4;
  if (0xfffff < (uVar16 ^ (ev->ev_timeout).tv_usec)) goto LAB_002d1435;
  ptVar27 = &ev->ev_timeout;
  *(undefined8 *)(puVar22 + -8) = 0x2d10bd;
  gettime(unaff_R15,(timeval *)(puVar22 + 0x20));
  uVar16 = (ev->ev_timeout).tv_usec;
  if ((((uint)uVar16 & 0xf0000000) == 0x50000000) &&
     ((int)((uint)(uVar16 >> 0x14) & 0xff) < unaff_R15->n_common_timeouts)) {
    lVar20 = (ev->ev_).ev_io.ev_timeout.tv_sec;
    uVar13 = (uint)(ev->ev_).ev_io.ev_timeout.tv_usec;
    uVar17 = uVar13 & 0xfff00000;
    psVar24 = (short *)(ulong)(uVar13 & 0xfffff);
    if ((ev->ev_res & 1) == 0) {
      uVar16 = *(ulong *)(puVar22 + 0x28);
      ptVar27 = (timeval *)(puVar22 + 0x20);
    }
    else {
      uVar16 = (ulong)((uint)uVar16 & 0xfffff);
    }
  }
  else {
    bVar28 = (ev->ev_res & 1) == 0;
    lVar20 = (ev->ev_).ev_io.ev_timeout.tv_sec;
    if (bVar28) {
      uVar16 = *(ulong *)(puVar22 + 0x28);
    }
    psVar24 = (ev->ev_).ev_signal.ev_pncalls;
    if (bVar28) {
      ptVar27 = (timeval *)(puVar22 + 0x20);
    }
    uVar17 = 0;
  }
  lVar26 = ptVar27->tv_sec + lVar20;
  *(long *)(puVar22 + 0x10) = lVar26;
  uVar16 = uVar16 + (long)psVar24;
  if (999999 < (long)uVar16) {
    lVar26 = lVar26 + 1;
    *(long *)(puVar22 + 0x10) = lVar26;
    uVar16 = uVar16 - 1000000;
  }
  lVar5 = *(long *)(puVar22 + 0x20);
  if (lVar26 == lVar5) {
    lVar26 = *(long *)(puVar22 + 0x28);
    if ((long)uVar16 < lVar26) {
LAB_002d12b4:
      *(long *)(puVar22 + 0x10) = lVar5 + lVar20;
      uVar16 = lVar26 + (long)psVar24;
      if (999999 < (long)uVar16) {
        *(long *)(puVar22 + 0x10) = lVar5 + lVar20 + 1;
        uVar16 = uVar16 - 1000000;
      }
    }
  }
  else if (lVar26 < lVar5) {
    lVar26 = *(long *)(puVar22 + 0x28);
    goto LAB_002d12b4;
  }
  *(ulong *)(puVar22 + 0x18) = uVar17 | uVar16;
  *(undefined8 *)(puVar22 + -8) = 0x2d12f4;
  event_add_nolock_(ev,(timeval *)(puVar22 + 0x10),1);
LAB_002d12f4:
  p_Var7 = (ev->ev_evcallback).evcb_cb_union.evcb_callback;
  pvVar23 = (ev->ev_evcallback).evcb_arg;
  iVar12 = ev->ev_fd;
  sVar11 = ev->ev_res;
  pvVar6 = unaff_R15->th_base_lock;
  if (pvVar6 != (void *)0x0) {
    *(undefined8 *)(puVar22 + -8) = 0x2d131c;
    (*evthread_lock_fns_.unlock)(0,pvVar6);
  }
  *(undefined8 *)(puVar22 + -8) = 0x2d1327;
  (*p_Var7)(iVar12,sVar11,pvVar23);
  evcb_00 = extraout_RDX_17;
  goto LAB_002d1327;
}

Assistant:

int
event_callback_cancel_nolock_(struct event_base *base,
    struct event_callback *evcb, int even_if_finalizing)
{
	if ((evcb->evcb_flags & EVLIST_FINALIZING) && !even_if_finalizing)
		return 0;

	if (evcb->evcb_flags & EVLIST_INIT)
		return event_del_nolock_(event_callback_to_event(evcb),
		    even_if_finalizing ? EVENT_DEL_EVEN_IF_FINALIZING : EVENT_DEL_AUTOBLOCK);

	switch ((evcb->evcb_flags & (EVLIST_ACTIVE|EVLIST_ACTIVE_LATER))) {
	default:
	case EVLIST_ACTIVE|EVLIST_ACTIVE_LATER:
		EVUTIL_ASSERT(0);
		break;
	case EVLIST_ACTIVE:
		/* We get different kinds of events, add them together */
		event_queue_remove_active(base, evcb);
		return 0;
	case EVLIST_ACTIVE_LATER:
		event_queue_remove_active_later(base, evcb);
		break;
	case 0:
		break;
	}

	return 0;
}